

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.h
# Opt level: O0

Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
ki::dml::Record::add_field<std::__cxx11::string>(Record *this,string *name,bool transferable)

{
  bool bVar1;
  mapped_type *ppFVar2;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  Record *local_b8;
  string local_88 [32];
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_68;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *field;
  FieldBase *field_1;
  string local_48 [39];
  byte local_21;
  string *psStack_20;
  bool transferable_local;
  string *name_local;
  Record *this_local;
  
  local_21 = transferable;
  psStack_20 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)name);
  bVar1 = has_field(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  if (bVar1) {
    ppFVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
              ::at(&this->m_field_map,name);
    field = (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)*ppFVar2;
    bVar1 = FieldBase::is_type<std::__cxx11::string>((FieldBase *)field);
    if (bVar1) {
      if (field == (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0) {
        local_b8 = (Record *)0x0;
      }
      else {
        local_b8 = (Record *)
                   __dynamic_cast(field,&FieldBase::typeinfo,&Field<std::__cxx11::string>::typeinfo,
                                  0);
      }
      this_local = local_b8;
    }
    else {
      this_local = (Record *)0x0;
    }
  }
  else {
    this_00 = (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0x58);
    std::__cxx11::string::string(local_88,(string *)name);
    Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Field
              (this_00,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    (this_00->super_FieldBase).m_transferable = (bool)(local_21 & 1);
    local_68 = this_00;
    add_field(this,(FieldBase *)this_00);
    this_local = (Record *)local_68;
  }
  return (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         this_local;
}

Assistant:

Field<ValueT> *add_field(std::string name, bool transferable = true)
		{
			// Does this field already exist?
			if (has_field(name))
			{
				// Return nullptr if the type is not the same
				auto *field = m_field_map.at(name);
				if (!field->is_type<ValueT>())
					return nullptr;
				return dynamic_cast<Field<ValueT> *>(field);
			}

			// Create the field
			auto *field = new Field<ValueT>(name);
			field->m_transferable = transferable;
			add_field(field);
			return field;
		}